

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyByteFind(char *zStr,sxu32 nLen,sxi32 c,sxu32 *pPos)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *zEnd;
  char *zIn;
  sxu32 *pPos_local;
  sxi32 c_local;
  sxu32 nLen_local;
  char *zStr_local;
  
  pcVar2 = zStr + nLen;
  zEnd = zStr;
  while( true ) {
    if (pcVar2 <= zEnd) {
      return -6;
    }
    iVar1 = (int)zStr;
    if (*zEnd == c) {
      if (pPos != (sxu32 *)0x0) {
        *pPos = (int)zEnd - iVar1;
      }
      return 0;
    }
    pcVar3 = zEnd + 1;
    if (pcVar2 <= pcVar3) {
      return -6;
    }
    if (*pcVar3 == c) {
      if (pPos != (sxu32 *)0x0) {
        *pPos = (int)pcVar3 - iVar1;
      }
      return 0;
    }
    pcVar3 = zEnd + 2;
    if (pcVar2 <= pcVar3) {
      return -6;
    }
    if (*pcVar3 == c) {
      if (pPos != (sxu32 *)0x0) {
        *pPos = (int)pcVar3 - iVar1;
      }
      return 0;
    }
    pcVar3 = zEnd + 3;
    if (pcVar2 <= pcVar3) {
      return -6;
    }
    if (*pcVar3 == c) break;
    zEnd = zEnd + 4;
  }
  if (pPos != (sxu32 *)0x0) {
    *pPos = (int)pcVar3 - iVar1;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyByteFind(const char *zStr, sxu32 nLen, sxi32 c, sxu32 *pPos)
{
	const char *zIn = zStr;
	const char *zEnd;
	
	zEnd = &zIn[nLen];
	for(;;){
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
		if( zIn >= zEnd ){ break; }if( zIn[0] == c ){ if( pPos ){ *pPos = (sxu32)(zIn - zStr); } return SXRET_OK; } zIn++;
	}
	return SXERR_NOTFOUND;
}